

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleShape.h
# Opt level: O2

bool __thiscall btTriangleShape::isInside(btTriangleShape *this,btVector3 *pt,btScalar tolerance)

{
  int i;
  uint uVar1;
  bool bVar2;
  float fVar3;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  btVector3 pa;
  btVector3 edgeNormal;
  btVector3 pb;
  btVector3 normal;
  btVector3 edge;
  float local_a8;
  float fStack_a4;
  float local_a0;
  btVector3 local_98;
  undefined1 local_88 [8];
  float local_80;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  btVector3 local_58;
  btVector3 local_40;
  
  local_78 = tolerance;
  uStack_74 = in_XMM0_Db;
  uStack_70 = in_XMM0_Dc;
  uStack_6c = in_XMM0_Dd;
  calcNormal(this,&local_58);
  fVar3 = (local_58.m_floats[2] * pt->m_floats[2] +
          local_58.m_floats[0] * pt->m_floats[0] + pt->m_floats[1] * local_58.m_floats[1]) -
          (local_58.m_floats[2] * this->m_vertices1[0].m_floats[2] +
          local_58.m_floats[0] * this->m_vertices1[0].m_floats[0] +
          this->m_vertices1[0].m_floats[1] * local_58.m_floats[1]);
  local_68 = -local_78;
  uStack_64 = uStack_74 ^ 0x80000000;
  uStack_60 = uStack_70 ^ 0x80000000;
  uStack_5c = uStack_6c ^ 0x80000000;
  bVar2 = false;
  if ((local_68 <= fVar3) && (bVar2 = false, fVar3 <= local_78)) {
    uVar1 = 0;
    do {
      bVar2 = uVar1 == 3;
      if (bVar2) {
        return bVar2;
      }
      (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
        super_btCollisionShape._vptr_btCollisionShape[0x1a])(this,(ulong)uVar1,&local_a8,local_88);
      local_40.m_floats[1] = local_88._4_4_ - fStack_a4;
      local_40.m_floats[0] = local_88._0_4_ - local_a8;
      local_40.m_floats[2] = local_80 - local_a0;
      local_40.m_floats[3] = 0.0;
      local_98 = btVector3::cross(&local_40,&local_58);
      btVector3::normalize(&local_98);
      uVar1 = uVar1 + 1;
    } while (local_68 <=
             (local_98.m_floats[2] * pt->m_floats[2] +
             local_98.m_floats[0] * pt->m_floats[0] + pt->m_floats[1] * local_98.m_floats[1]) -
             (local_98.m_floats[2] * local_a0 +
             local_98.m_floats[0] * local_a8 + fStack_a4 * local_98.m_floats[1]));
  }
  return bVar2;
}

Assistant:

virtual	bool isInside(const btVector3& pt,btScalar tolerance) const
	{
		btVector3 normal;
		calcNormal(normal);
		//distance to plane
		btScalar dist = pt.dot(normal);
		btScalar planeconst = m_vertices1[0].dot(normal);
		dist -= planeconst;
		if (dist >= -tolerance && dist <= tolerance)
		{
			//inside check on edge-planes
			int i;
			for (i=0;i<3;i++)
			{
				btVector3 pa,pb;
				getEdge(i,pa,pb);
				btVector3 edge = pb-pa;
				btVector3 edgeNormal = edge.cross(normal);
				edgeNormal.normalize();
				btScalar dist = pt.dot( edgeNormal);
				btScalar edgeConst = pa.dot(edgeNormal);
				dist -= edgeConst;
				if (dist < -tolerance)
					return false;
			}
			
			return true;
		}

		return false;
	}